

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

int luaD_precall(lua_State *L,StkId func,int nresults)

{
  lua_CFunction *pp_Var1;
  byte bVar2;
  StkId pTVar3;
  long lVar4;
  lua_CFunction p_Var5;
  uint uVar6;
  int iVar7;
  TValue *pTVar8;
  CallInfo *pCVar9;
  long lVar10;
  uint uVar11;
  StkId pTVar12;
  long lVar13;
  
  while( true ) {
    lVar13 = (long)func - (long)L->stack;
    uVar6 = func->tt_ & 0x3f;
    if (uVar6 == 6) {
      lVar4 = *(long *)((func->value_).f + 0x18);
      pTVar12 = L->top;
      if ((long)L->stack_last - (long)pTVar12 >> 4 <= (long)(ulong)*(byte *)(lVar4 + 0x7a)) {
        luaD_growstack(L,(uint)*(byte *)(lVar4 + 0x7a));
      }
      bVar2 = *(byte *)(lVar4 + 0x78);
      uVar6 = (uint)bVar2;
      iVar7 = (int)((ulong)((long)pTVar12 - (long)func) >> 4);
      if ((int)(uint)bVar2 < iVar7) {
        uVar11 = iVar7 - 1;
      }
      else {
        pTVar12 = L->top;
        iVar7 = (uVar6 - iVar7) + 1;
        do {
          pTVar12->tt_ = 0;
          pTVar12 = pTVar12 + 1;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        L->top = pTVar12;
        uVar11 = uVar6;
      }
      if (*(char *)(lVar4 + 0x79) == '\0') {
        pTVar3 = L->stack;
        pTVar12 = (StkId)((long)pTVar3 + lVar13 + 0x10);
      }
      else {
        if ((long)L->stack_last - (long)L->top >> 4 <= (long)(ulong)*(byte *)(lVar4 + 0x7a)) {
          luaD_growstack(L,(uint)*(byte *)(lVar4 + 0x7a));
        }
        pTVar12 = L->top;
        if (uVar6 != 0) {
          lVar10 = 0;
          do {
            pTVar3 = L->top;
            L->top = pTVar3 + 1;
            pTVar3->value_ = *(Value *)((long)&pTVar12[-(ulong)uVar11].value_ + lVar10);
            pTVar3->tt_ = *(int *)((long)&pTVar12[-(ulong)uVar11].tt_ + lVar10);
            *(undefined4 *)((long)&pTVar12[-(ulong)uVar11].tt_ + lVar10) = 0;
            lVar10 = lVar10 + 0x10;
          } while ((ulong)bVar2 << 4 != lVar10);
        }
        pTVar3 = L->stack;
      }
      pCVar9 = L->ci->next;
      if (pCVar9 == (CallInfo *)0x0) {
        pCVar9 = luaE_extendCI(L);
      }
      L->ci = pCVar9;
      pCVar9->nresults = (short)nresults;
      pCVar9->func = (StkId)(lVar13 + (long)pTVar3);
      (pCVar9->u).l.base = pTVar12;
      bVar2 = *(byte *)(lVar4 + 0x7a);
      pCVar9->top = pTVar12 + bVar2;
      (pCVar9->u).l.savedpc = *(Instruction **)(lVar4 + 0x18);
      pCVar9->callstatus = '\x01';
      L->top = pTVar12 + bVar2;
      if (0 < L->l_G->GCdebt) {
        luaC_step(L);
      }
      if ((L->hookmask & 1) != 0) {
        pp_Var1 = &(pCVar9->u).c.k;
        *pp_Var1 = *pp_Var1 + 4;
        iVar7 = 0;
        if (((pCVar9->previous->callstatus & 1) != 0) &&
           ((*(uint *)((pCVar9->previous->u).c.k + -4) & 0x3f) == 0x1e)) {
          pCVar9->callstatus = pCVar9->callstatus | 0x40;
          iVar7 = 4;
        }
        luaD_hook(L,iVar7,-1);
        pp_Var1 = &(pCVar9->u).c.k;
        *pp_Var1 = *pp_Var1 + -4;
      }
      return 0;
    }
    if (uVar6 == 0x16) break;
    if (uVar6 == 0x26) {
      func = (StkId)((func->value_).f + 0x18);
      break;
    }
    pTVar8 = luaT_gettmbyobj(L,func,TM_CALL);
    if ((pTVar8->tt_ & 0xfU) != 6) {
      luaG_typeerror(L,func,"call");
    }
    pTVar3 = L->stack;
    for (pTVar12 = L->top; func < pTVar12; pTVar12 = pTVar12 + -1) {
      pTVar12->value_ = pTVar12[-1].value_;
      pTVar12->tt_ = pTVar12[-1].tt_;
    }
    pTVar12 = L->top;
    L->top = pTVar12 + 1;
    if ((long)L->stack_last - (long)(pTVar12 + 1) < 0x10) {
      luaD_growstack(L,0);
    }
    lVar13 = (long)func - (long)pTVar3;
    pTVar12 = L->stack;
    *(Value *)((long)pTVar12 + lVar13) = pTVar8->value_;
    *(int *)((long)pTVar12 + lVar13 + 8) = pTVar8->tt_;
    func = (StkId)(lVar13 + (long)pTVar12);
  }
  p_Var5 = (func->value_).f;
  if ((long)L->stack_last - (long)L->top < 0x150) {
    luaD_growstack(L,0x14);
  }
  pCVar9 = L->ci->next;
  if (pCVar9 == (CallInfo *)0x0) {
    pCVar9 = luaE_extendCI(L);
  }
  L->ci = pCVar9;
  pCVar9->nresults = (short)nresults;
  pCVar9->func = (StkId)(lVar13 + (long)L->stack);
  pCVar9->top = L->top + 0x14;
  pCVar9->callstatus = '\0';
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  if ((L->hookmask & 1) != 0) {
    luaD_hook(L,0,-1);
  }
  iVar7 = (*p_Var5)(L);
  luaD_poscall(L,L->top + -(long)iVar7);
  return 1;
}

Assistant:

int luaD_precall (lua_State *L, StkId func, int nresults) {
  lua_CFunction f;
  CallInfo *ci;
  int n;  /* number of arguments (Lua) or returns (C) */
  ptrdiff_t funcr = savestack(L, func);
  switch (ttype(func)) {
    case LUA_TLCF:  /* light C function */
      f = fvalue(func);
      goto Cfunc;
    case LUA_TCCL: {  /* C closure */
      f = clCvalue(func)->f;
     Cfunc:
      luaD_checkstack(L, LUA_MINSTACK);  /* ensure minimum stack size */
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = restorestack(L, funcr);
      ci->top = L->top + LUA_MINSTACK;
      lua_assert(ci->top <= L->stack_last);
      ci->callstatus = 0;
      luaC_checkGC(L);  /* stack grow uses memory */
      if (L->hookmask & LUA_MASKCALL)
        luaD_hook(L, LUA_HOOKCALL, -1);
      lua_unlock(L);
      n = (*f)(L);  /* do the actual call */
      lua_lock(L);
      api_checknelems(L, n);
      luaD_poscall(L, L->top - n);
      return 1;
    }
    case LUA_TLCL: {  /* Lua function: prepare its call */
      StkId base;
      Proto *p = clLvalue(func)->p;
      n = cast_int(L->top - func) - 1;  /* number of real arguments */
      luaD_checkstack(L, p->maxstacksize);
      for (; n < p->numparams; n++)
        setnilvalue(L->top++);  /* complete missing arguments */
      if (!p->is_vararg) {
        func = restorestack(L, funcr);
        base = func + 1;
      }
      else {
        base = adjust_varargs(L, p, n);
        func = restorestack(L, funcr);  /* previous call can change stack */
      }
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = func;
      ci->u.l.base = base;
      ci->top = base + p->maxstacksize;
      lua_assert(ci->top <= L->stack_last);
      ci->u.l.savedpc = p->code;  /* starting point */
      ci->callstatus = CIST_LUA;
      L->top = ci->top;
      luaC_checkGC(L);  /* stack grow uses memory */
      if (L->hookmask & LUA_MASKCALL)
        callhook(L, ci);
      return 0;
    }
    default: {  /* not a function */
      func = tryfuncTM(L, func);  /* retry with 'function' tag method */
      return luaD_precall(L, func, nresults);  /* now it must be a function */
    }
  }
}